

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_buffer_encode(aec_stream *strm)

{
  int iVar1;
  aec_stream *in_RDI;
  int status;
  aec_stream *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffffc;
  
  iVar1 = aec_encode_init((aec_stream *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == 0) {
    iVar1 = aec_encode(unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar1 == 0) {
      iVar1 = aec_encode_end(in_RDI);
    }
    else {
      cleanup((EVP_PKEY_CTX *)in_RDI);
    }
  }
  return iVar1;
}

Assistant:

int aec_buffer_encode(struct aec_stream *strm)
{
    int status = aec_encode_init(strm);
    if (status != AEC_OK)
        return status;
    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        cleanup(strm);
        return status;
    }
    return aec_encode_end(strm);
}